

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

FastString MQTTStringPrintf(char *format,...)

{
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar1;
  char *in_RSI;
  FastString FVar2;
  int local_23c;
  char local_238 [4];
  int err;
  char buf [512];
  va_list argp;
  char *format_local;
  
  buf[0x1fc] = '0';
  buf[0x1fd] = '\0';
  buf[0x1fe] = '\0';
  buf[0x1ff] = '\0';
  buf[0x1f8] = '\x10';
  buf[0x1f9] = '\0';
  buf[0x1fa] = '\0';
  buf[0x1fb] = '\0';
  local_23c = vsnprintf(local_238,0x200,in_RSI,buf + 0x1f8);
  if (local_23c < 1) {
    Bstrlib::String::String((String *)format);
    puVar1 = extraout_RDX;
  }
  else {
    if (0x1ff < local_23c) {
      local_23c = 0x1ff;
    }
    local_238[local_23c] = '\0';
    Bstrlib::String::String((String *)format,local_238,local_23c);
    puVar1 = extraout_RDX_00;
  }
  FVar2.super_tagbstring.data = puVar1;
  FVar2.super_tagbstring._0_8_ = format;
  return (FastString)FVar2.super_tagbstring;
}

Assistant:

static MQTTString MQTTStringPrintf(const char * format, ...)
      {
          va_list argp;
          va_start(argp, format);
          char buf[512];
          // We use vasprintf extension to avoid dual parsing of the format string to find out the required length
          int err = vsnprintf(buf, sizeof(buf), format, argp);
          va_end(argp);
          if (err <= 0) return MQTTString();
          if (err >= (int)sizeof(buf)) err = (int)(sizeof(buf) - 1);
          buf[err] = 0;
          return MQTTString(buf, (size_t)err);
      }